

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrGLContext.cpp
# Opt level: O0

void __thiscall sglr::GLContext::~GLContext(GLContext *this)

{
  ShaderProgram *this_00;
  CallLogWrapper *this_01;
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  reference ppSVar3;
  __normal_iterator<glu::ShaderProgram_**,_std::vector<glu::ShaderProgram_*,_std::allocator<glu::ShaderProgram_*>_>_>
  local_c8;
  __normal_iterator<glu::ShaderProgram_**,_std::vector<glu::ShaderProgram_*,_std::allocator<glu::ShaderProgram_*>_>_>
  local_c0;
  iterator i_5;
  iterator iStack_a8;
  deUint32 vao;
  _Self local_a0;
  const_iterator i_4;
  iterator iStack_88;
  deUint32 buf;
  _Self local_80;
  const_iterator i_3;
  iterator iStack_68;
  deUint32 tex;
  _Self local_60;
  const_iterator i_2;
  iterator iStack_48;
  deUint32 rbo;
  _Self local_40;
  const_iterator i_1;
  iterator iStack_28;
  deUint32 fbo;
  _Self local_20;
  const_iterator i;
  Functions *gl;
  GLContext *this_local;
  
  (this->super_Context)._vptr_Context = (_func_int **)&PTR__GLContext_032e8be0;
  iVar2 = (*this->m_context->_vptr_RenderContext[3])();
  i._M_node = (_Base_ptr)CONCAT44(extraout_var,iVar2);
  local_20._M_node =
       (_Base_ptr)
       std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::begin
                 (&this->m_allocatedFbos);
  while( true ) {
    iStack_28 = std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::end
                          (&this->m_allocatedFbos);
    bVar1 = std::operator!=(&local_20,&stack0xffffffffffffffd8);
    if (!bVar1) break;
    std::_Rb_tree_const_iterator<unsigned_int>::operator*(&local_20);
    (**(code **)(i._M_node + 0x22))(1);
    i_1._M_node = (_Base_ptr)std::_Rb_tree_const_iterator<unsigned_int>::operator++(&local_20,0);
  }
  local_40._M_node =
       (_Base_ptr)
       std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::begin
                 (&this->m_allocatedRbos);
  while( true ) {
    iStack_48 = std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::end
                          (&this->m_allocatedRbos);
    bVar1 = std::operator!=(&local_40,&stack0xffffffffffffffb8);
    if (!bVar1) break;
    std::_Rb_tree_const_iterator<unsigned_int>::operator*(&local_40);
    (**(code **)(i._M_node + 0x23))(1);
    i_2._M_node = (_Base_ptr)std::_Rb_tree_const_iterator<unsigned_int>::operator++(&local_40,0);
  }
  local_60._M_node =
       (_Base_ptr)
       std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::begin
                 (&this->m_allocatedTextures);
  while( true ) {
    iStack_68 = std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::end
                          (&this->m_allocatedTextures);
    bVar1 = std::operator!=(&local_60,&stack0xffffffffffffff98);
    if (!bVar1) break;
    std::_Rb_tree_const_iterator<unsigned_int>::operator*(&local_60);
    (**(code **)(i._M_node + 0x24))(1);
    i_3._M_node = (_Base_ptr)std::_Rb_tree_const_iterator<unsigned_int>::operator++(&local_60,0);
  }
  local_80._M_node =
       (_Base_ptr)
       std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::begin
                 (&this->m_allocatedBuffers);
  while( true ) {
    iStack_88 = std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::end
                          (&this->m_allocatedBuffers);
    bVar1 = std::operator!=(&local_80,&stack0xffffffffffffff78);
    if (!bVar1) break;
    std::_Rb_tree_const_iterator<unsigned_int>::operator*(&local_80);
    (*(code *)i._M_node[0x21]._M_right)(1);
    i_4._M_node = (_Base_ptr)std::_Rb_tree_const_iterator<unsigned_int>::operator++(&local_80,0);
  }
  local_a0._M_node =
       (_Base_ptr)
       std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::begin
                 (&this->m_allocatedVaos);
  while( true ) {
    iStack_a8 = std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::end
                          (&this->m_allocatedVaos);
    bVar1 = std::operator!=(&local_a0,&stack0xffffffffffffff58);
    if (!bVar1) break;
    std::_Rb_tree_const_iterator<unsigned_int>::operator*(&local_a0);
    (*(code *)i._M_node[0x24]._M_left)(1);
    i_5._M_current =
         (ShaderProgram **)std::_Rb_tree_const_iterator<unsigned_int>::operator++(&local_a0,0);
  }
  local_c0._M_current =
       (ShaderProgram **)
       std::vector<glu::ShaderProgram_*,_std::allocator<glu::ShaderProgram_*>_>::begin
                 (&this->m_programs);
  while( true ) {
    local_c8._M_current =
         (ShaderProgram **)
         std::vector<glu::ShaderProgram_*,_std::allocator<glu::ShaderProgram_*>_>::end
                   (&this->m_programs);
    bVar1 = __gnu_cxx::operator!=(&local_c0,&local_c8);
    if (!bVar1) break;
    ppSVar3 = __gnu_cxx::
              __normal_iterator<glu::ShaderProgram_**,_std::vector<glu::ShaderProgram_*,_std::allocator<glu::ShaderProgram_*>_>_>
              ::operator*(&local_c0);
    this_00 = *ppSVar3;
    if (this_00 != (ShaderProgram *)0x0) {
      glu::ShaderProgram::~ShaderProgram(this_00);
      operator_delete(this_00,0xd0);
    }
    __gnu_cxx::
    __normal_iterator<glu::ShaderProgram_**,_std::vector<glu::ShaderProgram_*,_std::allocator<glu::ShaderProgram_*>_>_>
    ::operator++(&local_c0,0);
  }
  (**(code **)(i._M_node + 0xb4))(0);
  this_01 = this->m_wrapper;
  if (this_01 != (CallLogWrapper *)0x0) {
    glu::CallLogWrapper::~CallLogWrapper(this_01);
    operator_delete(this_01,0x18);
  }
  std::vector<glu::ShaderProgram_*,_std::allocator<glu::ShaderProgram_*>_>::~vector
            (&this->m_programs);
  std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::~set
            (&this->m_allocatedVaos);
  std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::~set
            (&this->m_allocatedBuffers);
  std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::~set
            (&this->m_allocatedRbos);
  std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::~set
            (&this->m_allocatedFbos);
  std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::~set
            (&this->m_allocatedTextures);
  sglr::Context::~Context(&this->super_Context);
  return;
}

Assistant:

GLContext::~GLContext (void)
{
	const glw::Functions& gl = m_context.getFunctions();

	// Clean up all still alive objects
	for (std::set<deUint32>::const_iterator i = m_allocatedFbos.begin();
		 i != m_allocatedFbos.end(); i++)
	{
		deUint32 fbo = *i;
		gl.deleteFramebuffers(1, &fbo);
	}

	for (std::set<deUint32>::const_iterator i = m_allocatedRbos.begin();
		 i != m_allocatedRbos.end(); i++)
	{
		deUint32 rbo = *i;
		gl.deleteRenderbuffers(1, &rbo);
	}

	for (std::set<deUint32>::const_iterator i = m_allocatedTextures.begin();
		 i != m_allocatedTextures.end(); i++)
	{
		deUint32 tex = *i;
		gl.deleteTextures(1, &tex);
	}

	for (std::set<deUint32>::const_iterator i = m_allocatedBuffers.begin();
		 i != m_allocatedBuffers.end(); i++)
	{
		deUint32 buf = *i;
		gl.deleteBuffers(1, &buf);
	}

	for (std::set<deUint32>::const_iterator i = m_allocatedVaos.begin();
		 i != m_allocatedVaos.end(); i++)
	{
		deUint32 vao = *i;
		gl.deleteVertexArrays(1, &vao);
	}

	for (std::vector<glu::ShaderProgram*>::iterator i = m_programs.begin();
		i != m_programs.end(); i++)
	{
		delete *i;
	}

	gl.useProgram(0);

	delete m_wrapper;
}